

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall
rest_rpc::rpc_client::rpc_client
          (rpc_client *this,client_language_t client_language,
          function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *on_result_received_callback)

{
  noncopyable *__a;
  undefined4 in_ESI;
  noncopyable *in_RDI;
  noncopyable *this_00;
  noncopyable *__args;
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  io_context *in_stack_ffffffffffffff18;
  function<void_(std::error_code)> *in_stack_ffffffffffffff20;
  allocator<char> *__n;
  io_context *in_stack_ffffffffffffff40;
  io_context *in_stack_ffffffffffffff48;
  noncopyable *local_a0;
  allocator<char> local_25 [25];
  undefined4 local_c;
  
  local_c = in_ESI;
  asio::detail::noncopyable::noncopyable(in_RDI);
  asio::io_context::io_context(in_stack_ffffffffffffff40);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,0);
  std::make_shared<asio::io_context::work,asio::io_context&>(in_stack_ffffffffffffff48);
  std::shared_ptr<std::thread>::shared_ptr
            ((shared_ptr<std::thread> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::string((string *)(in_RDI + 0x90));
  *(undefined2 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 1000;
  *(undefined4 *)(in_RDI + 0xc0) = 0xffffffff;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff20,
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
  std::mutex::mutex((mutex *)0x29edad);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xf0));
  in_RDI[0x120] = (noncopyable)0x0;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer<asio::io_context>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
  in_RDI[0x1a0] = (noncopyable)0x0;
  std::
  deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ::deque((deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
           *)0x29ee13);
  *(undefined4 *)(in_RDI + 0x1f8) = 0;
  std::mutex::mutex((mutex *)0x29ee33);
  *(undefined8 *)(in_RDI + 0x228) = 0;
  this_00 = in_RDI + 0x230;
  std::function<void_(std::error_code)>::function(in_stack_ffffffffffffff20);
  in_RDI[0x250] = (noncopyable)0x0;
  __args = in_RDI + 600;
  std::
  unordered_map<unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>_>
                   *)0x29ee77);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
                   *)0x29ee90);
  std::mutex::mutex((mutex *)0x29eea4);
  *(undefined8 *)(in_RDI + 0x2f0) = 0;
  *(undefined8 *)(in_RDI + 0x2f8) = 0;
  local_a0 = in_RDI + 0x300;
  do {
    *local_a0 = (noncopyable)0x0;
    local_a0 = local_a0 + 1;
  } while (local_a0 != in_RDI + 0x314);
  __a = in_RDI + 0x318;
  __n = local_25;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)this_00,(size_type)__n,(allocator_type *)__a);
  std::allocator<char>::~allocator(local_25);
  __x = (function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *)(in_RDI + 0x348);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   *)0x29ef54);
  this_01 = (function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)(in_RDI + 0x380);
  std::
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x29ef6d);
  *(undefined4 *)(in_RDI + 0x3b0) = local_c;
  std::
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_01,__x);
  std::
  make_shared<std::thread,rest_rpc::rpc_client::rpc_client(rest_rpc::client_language_t,std::function<void(long,std::__cxx11::string_const&)>)::_lambda()_1_>
            ((type *)__args);
  std::shared_ptr<std::thread>::operator=
            ((shared_ptr<std::thread> *)this_01,(shared_ptr<std::thread> *)__x);
  std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x29efeb);
  return;
}

Assistant:

rpc_client(client_language_t client_language,
             std::function<void(long, const std::string &)>
                 on_result_received_callback)
      : socket_(ios_), work_(std::make_shared<asio::io_context::work>(ios_)),
        deadline_(ios_), body_(INIT_BUF_SIZE),
        client_language_(client_language),
        on_result_received_callback_(std::move(on_result_received_callback)) {
    thd_ = std::make_shared<std::thread>([this] { ios_.run(); });
  }